

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O2

size_t convert<int>(char *buf,int value)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  
  uVar2 = (ulong)(uint)value;
  pcVar4 = buf;
  do {
    pcVar3 = pcVar4;
    iVar1 = (int)uVar2;
    *pcVar3 = zero[iVar1 % 10];
    pcVar4 = pcVar3 + 1;
    uVar2 = (long)iVar1 / 10 & 0xffffffff;
  } while (0x12 < iVar1 + 9U);
  if (value < 0) {
    *pcVar4 = '-';
    pcVar4 = pcVar3 + 2;
  }
  *pcVar4 = '\0';
  std::__reverse<char*>(buf,pcVar4);
  return (long)pcVar4 - (long)buf;
}

Assistant:

size_t convert(char buf[], T value) {
  T i = value;
  char* p = buf;

  do {
    int lsd = static_cast<int>(i % 10);
    i /= 10;
    *p++ = zero[lsd];
  } while (i != 0);

  if (value < 0) {
    *p++ = '-';
  }
  *p = '\0';
  std::reverse(buf, p);

  return p - buf;
}